

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O3

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,FunctionCallStmt *stmt)

{
  element_type *peVar1;
  element_type *peVar2;
  iterator __position;
  _Base_ptr p_Var3;
  ulong uVar4;
  _Rb_tree_header *p_Var5;
  pointer pcVar6;
  long *local_78 [2];
  long local_68 [2];
  size_type *local_58;
  string str;
  
  peVar1 = (stmt->func_).super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  str.field_2._8_8_ =
       (stmt->func_).super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)str.field_2._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)str.field_2._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)str.field_2._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)str.field_2._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)str.field_2._8_8_)->_M_use_count + 1;
    }
  }
  local_58 = &str._M_string_length;
  pcVar6 = (peVar1->function_name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar6,pcVar6 + (peVar1->function_name_)._M_string_length);
  peVar2 = (stmt->var_).super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = *(_Base_ptr *)
            ((long)&(peVar2->args_)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  p_Var5 = &(peVar2->args_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    do {
      (**(code **)(**(long **)(p_Var3 + 2) + 0xf8))(local_78);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78[0]);
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  uVar4 = 0xcbf29ce484222325;
  if (str._M_dataplus._M_p == (pointer)0x0) {
    uVar4 = 0xcbf29ce484222325;
  }
  else {
    pcVar6 = (pointer)0x0;
    do {
      uVar4 = (*(byte *)((long)local_58 + (long)pcVar6) ^ uVar4) * 0x100000001b3;
      pcVar6 = pcVar6 + 1;
    } while (str._M_dataplus._M_p != pcVar6);
  }
  local_78[0] = (long *)(uVar4 << ((byte)(this->super_IRVisitor).level & 0x3f) ^ 0xe3779b97f4a7c169)
  ;
  __position._M_current =
       (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->stmt_hashes_,__position,(unsigned_long *)local_78);
  }
  else {
    *__position._M_current = (unsigned_long)local_78[0];
    (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  if (local_58 != &str._M_string_length) {
    operator_delete(local_58,str._M_string_length + 1);
  }
  if (str.field_2._8_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)str.field_2._8_8_);
  }
  return;
}

Assistant:

void visit(FunctionCallStmt* stmt) override {
        // this is to hash the call args and func_def
        auto func = stmt->func();
        auto str = func->function_name();
        auto const& var = stmt->var();
        auto const& var_args = var->args();
        // this is ordered map
        for (auto const& iter : var_args) {
            str.append(iter.second->to_string());
        }
        uint64_t hash = hash_64_fnv1a(str.c_str(), str.size()) << level;
        constexpr uint64_t call_signature = shift_const(0x9e3779b97f4a7c16, 4);
        stmt_hashes_.emplace_back(hash ^ call_signature);
    }